

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCacheManager.cxx
# Opt level: O0

void __thiscall cmCacheManager::CacheEntry::SetProperty(CacheEntry *this,string *prop,char *value)

{
  bool bVar1;
  CacheEntryType CVar2;
  char *local_88;
  char *local_68;
  allocator<char> local_41;
  string local_40;
  char *local_20;
  char *value_local;
  string *prop_local;
  CacheEntry *this_local;
  
  local_20 = value;
  value_local = (char *)prop;
  prop_local = &this->Value;
  bVar1 = std::operator==(prop,"TYPE");
  if (bVar1) {
    if (local_20 == (char *)0x0) {
      local_68 = "STRING";
    }
    else {
      local_68 = local_20;
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,local_68,&local_41);
    CVar2 = cmState::StringToCacheEntryType(&local_40);
    this->Type = CVar2;
    std::__cxx11::string::~string((string *)&local_40);
    std::allocator<char>::~allocator(&local_41);
  }
  else {
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            value_local,"VALUE");
    if (bVar1) {
      if (local_20 == (char *)0x0) {
        local_88 = "";
      }
      else {
        local_88 = local_20;
      }
      std::__cxx11::string::operator=((string *)this,local_88);
    }
    else {
      cmPropertyMap::SetProperty(&this->Properties,(string *)value_local,local_20);
    }
  }
  return;
}

Assistant:

void cmCacheManager::CacheEntry::SetProperty(const std::string& prop,
                                             const char* value)
{
  if (prop == "TYPE") {
    this->Type = cmState::StringToCacheEntryType(value ? value : "STRING");
  } else if (prop == "VALUE") {
    this->Value = value ? value : "";
  } else {
    this->Properties.SetProperty(prop, value);
  }
}